

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int CertVerifyCallback(X509_STORE_CTX *store_ctx,void *arg)

{
  bool bVar1;
  int iVar2;
  SSL *ssl;
  TestConfig *pTVar3;
  TestState *pTVar4;
  
  iVar2 = SSL_get_ex_data_X509_STORE_CTX_idx();
  ssl = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)store_ctx,iVar2);
  pTVar3 = GetTestConfig(ssl);
  bVar1 = CheckVerifyCallback(ssl);
  iVar2 = 0;
  if (bVar1) {
    pTVar4 = GetTestState(ssl);
    pTVar4->cert_verified = true;
    if (pTVar3->verify_fail == true) {
      X509_STORE_CTX_set_error((X509_STORE_CTX *)store_ctx,0x32);
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int CertVerifyCallback(X509_STORE_CTX *store_ctx, void *arg) {
  SSL *ssl = (SSL *)X509_STORE_CTX_get_ex_data(
      store_ctx, SSL_get_ex_data_X509_STORE_CTX_idx());
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return 0;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    X509_STORE_CTX_set_error(store_ctx, X509_V_ERR_APPLICATION_VERIFICATION);
    return 0;
  }

  return 1;
}